

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void soplex::LPFwriteSVector<double>
               (SPxLPBase<double> *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<double> *p_svec,bool writeZeroCoefficients)

{
  ostream *poVar1;
  char *pcVar2;
  int j;
  int i;
  int iVar3;
  double dVar4;
  char name [16];
  
  iVar3 = 0;
  for (i = 0; i < (p_lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum; i = i + 1)
  {
    dVar4 = SVectorBase<double>::operator[](p_svec,i);
    if (dVar4 != 0.0 || writeZeroCoefficients) {
      if (iVar3 == 0) {
        poVar1 = std::ostream::_M_insert<double>(dVar4);
      }
      else {
        if (iVar3 % 5 == 0) {
          std::operator<<(p_output,"\n\t");
        }
        if (0.0 <= dVar4) {
          std::operator<<(p_output," + ");
        }
        else {
          std::operator<<(p_output," - ");
          dVar4 = -dVar4;
        }
        std::ostream::_M_insert<double>(dVar4);
        poVar1 = p_output;
      }
      poVar1 = std::operator<<(poVar1," ");
      pcVar2 = getColName<double>(p_lp,i,p_cnames,name);
      std::operator<<(poVar1,pcVar2);
      iVar3 = iVar3 + 1;
    }
  }
  return;
}

Assistant:

static void LPFwriteSVector(
   const SPxLPBase<R>&   p_lp,                         ///< the LP
   std::ostream&         p_output,                     ///< output stream
   const NameSet*        p_cnames,                     ///< column names
   const SVectorBase<R>& p_svec,                       ///< vector to write
   const bool            writeZeroCoefficients = false ///< write zero objective coefficients
)
{

   char name[16];
   int num_coeffs = 0;

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const R coeff = p_svec[j];

      if(coeff == 0 && !writeZeroCoefficients)
         continue;

      if(num_coeffs == 0)
         p_output << coeff << " " << getColName(p_lp, j, p_cnames, name);
      else
      {
         // insert a line break every SOPLEX_NUM_ENTRIES_PER_LINE columns
         if(num_coeffs % SOPLEX_NUM_ENTRIES_PER_LINE == 0)
            p_output << "\n\t";

         if(coeff < 0)
            p_output << " - " << -coeff;
         else
            p_output << " + " << coeff;

         p_output << " " << getColName(p_lp, j, p_cnames, name);
      }

      ++num_coeffs;
   }
}